

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::ScopeRandomizeFunction::checkArguments
          (ScopeRandomizeFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  pointer ppEVar2;
  size_t sVar3;
  Expression *this_00;
  bool bVar4;
  Symbol *this_01;
  DeclaredType *this_02;
  Type *pTVar5;
  Diagnostic *pDVar6;
  long lVar7;
  string_view arg;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar4 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,0,0x7fffffff);
  lVar7 = 400;
  if (bVar4) {
    ppEVar2 = args->_M_ptr;
    sVar3 = (args->_M_extent)._M_extent_value;
    for (lVar7 = 0; sVar3 << 3 != lVar7; lVar7 = lVar7 + 8) {
      this_00 = *(Expression **)((long)ppEVar2 + lVar7);
      this_01 = Expression::getSymbolReference(this_00,true);
      if ((this_01 == (Symbol *)0x0) || (this_00->kind != NamedValue)) {
        ASTContext::addDiag(context,(DiagCode)0xf000b,this_00->sourceRange);
        lVar7 = 400;
        goto LAB_0076702c;
      }
      this_02 = Symbol::getDeclaredType(this_01);
      pTVar5 = DeclaredType::getType(this_02);
      bVar4 = Type::isValidForRand(pTVar5,Rand,(pCVar1->options).languageVersion);
      if (!bVar4) {
        pDVar6 = ASTContext::addDiag(context,(DiagCode)0x610006,this_00->sourceRange);
        pTVar5 = DeclaredType::getType(this_02);
        pDVar6 = ast::operator<<(pDVar6,pTVar5);
        arg._M_str = "rand";
        arg._M_len = 4;
        Diagnostic::operator<<(pDVar6,arg);
      }
    }
    lVar7 = 0x158;
  }
LAB_0076702c:
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar7);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, INT32_MAX))
            return comp.getErrorType();

        for (auto arg : args) {
            auto sym = arg->getSymbolReference();
            if (!sym || arg->kind != ExpressionKind::NamedValue) {
                context.addDiag(diag::ExpectedVariableName, arg->sourceRange);
                return comp.getErrorType();
            }

            auto dt = sym->getDeclaredType();
            SLANG_ASSERT(dt);
            if (!dt->getType().isValidForRand(RandMode::Rand, comp.languageVersion())) {
                context.addDiag(diag::InvalidRandType, arg->sourceRange)
                    << dt->getType() << "rand"sv;
            }
        }

        return comp.getIntType();
    }